

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<long_*> * __thiscall
TPZVec<long_*>::operator=(TPZVec<long_*> *this,initializer_list<long_*> *list)

{
  iterator pplVar1;
  size_type sVar2;
  long **pplVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  pplVar1 = list->_M_array;
  sVar2 = list->_M_len;
  pplVar3 = this->fStore;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)pplVar3 + lVar4) = *(undefined8 *)((long)pplVar1 + lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}